

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_for_loop(jit_State *J,BCIns *fori,ScEvEntry *scev,int init)

{
  uint slot;
  TRef TVar1;
  TRef step_00;
  int dir_00;
  cTValue *tv_00;
  IRType local_64;
  IRType local_60;
  int dir;
  int tc;
  TRef step;
  TRef stop;
  int mode;
  IRType t;
  TRef idx;
  cTValue *tv;
  BCReg ra;
  int init_local;
  ScEvEntry *scev_local;
  BCIns *fori_local;
  jit_State *J_local;
  
  slot = *fori >> 8 & 0xff;
  tv_00 = J->L->base + slot;
  mode = J->base[slot];
  if (mode == 0) {
    if (init == 0) {
      local_64 = IRT_NUM;
    }
    else {
      local_64 = lj_opt_narrow_forl(J,tv_00);
    }
    local_60 = local_64;
  }
  else {
    local_60 = (uint)mode >> 0x18 & IRT_TYPE;
  }
  TVar1 = fori_arg(J,fori,slot + 1,local_60,0x30);
  step_00 = fori_arg(J,fori,slot + 2,local_60,0x30);
  dir_00 = rec_for_direction(tv_00 + 2);
  (scev->t).irt = (uint8_t)local_60;
  scev->dir = (uint8_t)dir_00;
  scev->stop = (IRRef1)TVar1;
  scev->step = (IRRef1)step_00;
  rec_for_check(J,local_60,dir_00,TVar1,step_00,init);
  TVar1 = find_kinit(J,fori,slot,IRT_INT);
  scev->start = (IRRef1)TVar1;
  if (mode == 0) {
    mode = fori_load(J,slot,local_60,(uint)(J->scev).start * 0x10000 + 0x20);
  }
  if (init == 0) {
    (J->fold).ins.field_0.ot = (ushort)local_60 | 0x2900;
    (J->fold).ins.field_0.op1 = (IRRef1)mode;
    (J->fold).ins.field_0.op2 = (IRRef1)step_00;
    mode = lj_opt_fold(J);
    J->base[slot] = mode;
  }
  J->base[slot + 3] = mode;
  scev->idx = (IRRef1)mode;
  (scev->pc).ptr64 = (uint64_t)fori;
  J->maxslot = slot + 4;
  return;
}

Assistant:

static void rec_for_loop(jit_State *J, const BCIns *fori, ScEvEntry *scev,
			 int init)
{
  BCReg ra = bc_a(*fori);
  cTValue *tv = &J->L->base[ra];
  TRef idx = J->base[ra+FORL_IDX];
  IRType t = idx ? tref_type(idx) :
	     (init || LJ_DUALNUM) ? lj_opt_narrow_forl(J, tv) : IRT_NUM;
  int mode = IRSLOAD_INHERIT +
    ((!LJ_DUALNUM || tvisint(tv) == (t == IRT_INT)) ? IRSLOAD_READONLY : 0);
  TRef stop = fori_arg(J, fori, ra+FORL_STOP, t, mode);
  TRef step = fori_arg(J, fori, ra+FORL_STEP, t, mode);
  int tc, dir = rec_for_direction(&tv[FORL_STEP]);
  lj_assertJ(bc_op(*fori) == BC_FORI || bc_op(*fori) == BC_JFORI,
	     "bad bytecode %d instead of FORI/JFORI", bc_op(*fori));
  scev->t.irt = t;
  scev->dir = dir;
  scev->stop = tref_ref(stop);
  scev->step = tref_ref(step);
  rec_for_check(J, t, dir, stop, step, init);
  scev->start = tref_ref(find_kinit(J, fori, ra+FORL_IDX, IRT_INT));
  tc = (LJ_DUALNUM &&
	!(scev->start && irref_isk(scev->stop) && irref_isk(scev->step) &&
	  tvisint(&tv[FORL_IDX]) == (t == IRT_INT))) ?
	IRSLOAD_TYPECHECK : 0;
  if (tc) {
    J->base[ra+FORL_STOP] = stop;
    J->base[ra+FORL_STEP] = step;
  }
  if (!idx)
    idx = fori_load(J, ra+FORL_IDX, t,
		    IRSLOAD_INHERIT + tc + (J->scev.start << 16));
  if (!init)
    J->base[ra+FORL_IDX] = idx = emitir(IRT(IR_ADD, t), idx, step);
  J->base[ra+FORL_EXT] = idx;
  scev->idx = tref_ref(idx);
  setmref(scev->pc, fori);
  J->maxslot = ra+FORL_EXT+1;
}